

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O3

int test(char *URL)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  ulong uVar12;
  timeval tVar13;
  int running;
  int msgs_left;
  fd_set fdwrite;
  fd_set fdread;
  fd_set fdexcep;
  int local_1e0;
  int local_1dc;
  ulong local_1d8;
  timeval local_1d0;
  undefined1 local_1bc [4];
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar10 = _stderr;
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar6 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                    ,0x3f);
      iVar2 = 0x7c;
    }
    else {
      lVar6 = curl_multi_init();
      if (lVar6 == 0) {
        lVar6 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                      ,0x41);
        iVar2 = 0x7b;
      }
      else {
        iVar2 = curl_easy_setopt(lVar5,0x29,1);
        if (iVar2 == 0) {
          bVar1 = true;
          do {
            iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
            uVar10 = _stderr;
            if (iVar2 != 0) {
              uVar4 = curl_easy_strerror(iVar2);
              pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uVar9 = 0x48;
              goto LAB_00102361;
            }
            if (bVar1) {
              iVar2 = curl_easy_setopt(lVar5,0x8d,1);
              uVar10 = _stderr;
              if (iVar2 != 0) {
                uVar4 = curl_easy_strerror(iVar2);
                pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar9 = 0x4c;
                goto LAB_00102361;
              }
            }
            else {
              iVar2 = curl_easy_setopt(lVar5,0x8d,0);
              uVar10 = _stderr;
              if (iVar2 != 0) {
                uVar4 = curl_easy_strerror(iVar2);
                pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar9 = 0x50;
                goto LAB_00102361;
              }
              iVar2 = curl_easy_setopt(lVar5,0x2c,1);
              uVar10 = _stderr;
              if (iVar2 != 0) {
                uVar4 = curl_easy_strerror(iVar2);
                pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar9 = 0x51;
                goto LAB_00102361;
              }
              iVar2 = curl_easy_setopt(lVar5,0x4b,1);
              uVar10 = _stderr;
              if (iVar2 != 0) {
                uVar4 = curl_easy_strerror(iVar2);
                pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar9 = 0x52;
                goto LAB_00102361;
              }
            }
            iVar2 = curl_multi_add_handle(lVar6,lVar5);
            uVar10 = _stderr;
            if (iVar2 != 0) {
              uVar4 = curl_multi_strerror(iVar2);
              pcVar11 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
              uVar9 = 0x55;
              goto LAB_00102361;
            }
LAB_001024a3:
            local_1d8 = 0xffffffffffffff9d;
            local_1e0 = -99;
            iVar2 = curl_multi_perform(lVar6,&local_1dc);
            uVar10 = _stderr;
            if (iVar2 != 0) {
              uVar4 = curl_multi_strerror(iVar2);
              pcVar11 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar9 = 0x5f;
              goto LAB_00102361;
            }
            if (local_1dc < 0) {
              pcVar11 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar10 = 0x5f;
LAB_001027eb:
              curl_mfprintf(_stderr,pcVar11,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,uVar10);
              iVar2 = 0x7a;
              goto LAB_001023ca;
            }
            tVar13 = tutil_tvnow();
            lVar7 = tutil_tvdiff(tVar13,tv_test_start);
            if (5000 < lVar7) {
              uVar10 = 0x61;
              goto LAB_001028ba;
            }
            if (local_1dc != 0) {
              local_138.__fds_bits[0xe] = 0;
              local_138.__fds_bits[0xf] = 0;
              local_138.__fds_bits[0xc] = 0;
              local_138.__fds_bits[0xd] = 0;
              local_138.__fds_bits[10] = 0;
              local_138.__fds_bits[0xb] = 0;
              local_138.__fds_bits[8] = 0;
              local_138.__fds_bits[9] = 0;
              local_138.__fds_bits[6] = 0;
              local_138.__fds_bits[7] = 0;
              local_138.__fds_bits[4] = 0;
              local_138.__fds_bits[5] = 0;
              local_138.__fds_bits[2] = 0;
              local_138.__fds_bits[3] = 0;
              local_138.__fds_bits[0] = 0;
              local_138.__fds_bits[1] = 0;
              local_1b8.__fds_bits[0] = 0;
              local_1b8.__fds_bits[1] = 0;
              local_1b8.__fds_bits[2] = 0;
              local_1b8.__fds_bits[3] = 0;
              local_1b8.__fds_bits[4] = 0;
              local_1b8.__fds_bits[5] = 0;
              local_1b8.__fds_bits[6] = 0;
              local_1b8.__fds_bits[7] = 0;
              local_1b8.__fds_bits[8] = 0;
              local_1b8.__fds_bits[9] = 0;
              local_1b8.__fds_bits[10] = 0;
              local_1b8.__fds_bits[0xb] = 0;
              local_1b8.__fds_bits[0xc] = 0;
              local_1b8.__fds_bits[0xd] = 0;
              local_1b8.__fds_bits[0xe] = 0;
              local_1b8.__fds_bits[0xf] = 0;
              local_b8.__fds_bits[0] = 0;
              local_b8.__fds_bits[1] = 0;
              local_b8.__fds_bits[2] = 0;
              local_b8.__fds_bits[3] = 0;
              local_b8.__fds_bits[4] = 0;
              local_b8.__fds_bits[5] = 0;
              local_b8.__fds_bits[6] = 0;
              local_b8.__fds_bits[7] = 0;
              local_b8.__fds_bits[8] = 0;
              local_b8.__fds_bits[9] = 0;
              local_b8.__fds_bits[10] = 0;
              local_b8.__fds_bits[0xb] = 0;
              local_b8.__fds_bits[0xc] = 0;
              local_b8.__fds_bits[0xd] = 0;
              local_b8.__fds_bits[0xe] = 0;
              local_b8.__fds_bits[0xf] = 0;
              iVar2 = curl_multi_fdset(lVar6,&local_138,&local_1b8,&local_b8,&local_1e0);
              uVar10 = _stderr;
              if (iVar2 == 0) {
                if (local_1e0 < -1) {
                  pcVar11 = 
                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                  uVar10 = 0x6a;
                  goto LAB_001027eb;
                }
                iVar2 = curl_multi_timeout(lVar6,&local_1d8);
                uVar10 = _stderr;
                if (iVar2 == 0) {
                  if ((long)local_1d8 < -1) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                  ,0x6e);
                    iVar2 = 0x73;
                  }
                  else {
                    if (local_1d8 == 0xffffffffffffffff) {
                      local_1d0.tv_sec = 6;
                      local_1d0.tv_usec = 0;
                    }
                    else {
                      uVar12 = local_1d8;
                      if (0x7ffffffe < local_1d8) {
                        uVar12 = 0x7fffffff;
                      }
                      local_1d0.tv_sec = uVar12 * 0x10624dd3 >> 0x26;
                      local_1d0.tv_usec =
                           (__suseconds_t)
                           (((int)uVar12 + (uint)(uVar12 * 0x10624dd3 >> 0x26) * -1000) * 1000);
                    }
                    iVar2 = select_wrapper(local_1e0 + 1,&local_138,&local_1b8,&local_b8,&local_1d0)
                    ;
                    if (iVar2 != -1) goto code_r0x00102683;
                    piVar8 = __errno_location();
                    uVar10 = _stderr;
                    iVar2 = *piVar8;
                    pcVar11 = strerror(iVar2);
                    curl_mfprintf(uVar10,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                  ,0x7d,iVar2,pcVar11);
                    iVar2 = 0x79;
                  }
                  goto LAB_001023ca;
                }
                uVar4 = curl_multi_strerror(iVar2);
                pcVar11 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
                uVar9 = 0x6e;
              }
              else {
                uVar4 = curl_multi_strerror(iVar2);
                pcVar11 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                uVar9 = 0x6a;
              }
              goto LAB_00102361;
            }
            lVar7 = curl_multi_info_read(lVar6,local_1bc);
            if (lVar7 == 0) {
              iVar3 = curl_multi_remove_handle(lVar6,lVar5);
              if (iVar3 != 0) goto LAB_001029df;
              if (!bVar1) {
                iVar2 = 0;
                goto LAB_001023ca;
              }
            }
            else {
              iVar2 = *(int *)(lVar7 + 0x10);
              iVar3 = curl_multi_remove_handle(lVar6,lVar5);
              if (iVar3 != 0) {
LAB_001029df:
                uVar10 = _stderr;
                uVar4 = curl_multi_strerror(iVar3);
                pcVar11 = "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n";
                uVar9 = 0x86;
                iVar2 = iVar3;
                goto LAB_00102361;
              }
              if (!(bool)(bVar1 & iVar2 == 0)) goto LAB_001023ca;
            }
            bVar1 = false;
            iVar2 = curl_easy_setopt(lVar5,0x29,1);
          } while (iVar2 == 0);
        }
        uVar10 = _stderr;
        uVar4 = curl_easy_strerror(iVar2);
        pcVar11 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar9 = 0x45;
LAB_00102361:
        curl_mfprintf(uVar10,pcVar11,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                      ,uVar9,iVar2,uVar4);
      }
    }
LAB_001023ca:
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar10,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                  ,0x3d,iVar2,uVar4);
  }
  return iVar2;
code_r0x00102683:
  tVar13 = tutil_tvnow();
  lVar7 = tutil_tvdiff(tVar13,tv_test_start);
  if (5000 < lVar7) {
    uVar10 = 0x7f;
LAB_001028ba:
    curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                  ,uVar10);
    iVar2 = 0x7d;
    goto LAB_001023ca;
  }
  goto LAB_001024a3;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(easy);

  multi_init(multi);

  for(phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if(phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if(phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than
         -1. */

      if(timeout != -1L) {
        int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
        interval.tv_sec = itimeout/1000;
        interval.tv_usec = (itimeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000 + 1;
        interval.tv_usec = 0;
      }

      select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}